

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::print_data(FILE *stream,void *data,uint64_t size,uint64_t start_address,void *prev,
                      uint64_t flags)

{
  undefined1 local_58 [8];
  iovec prev_iov;
  iovec iov;
  uint64_t flags_local;
  void *prev_local;
  uint64_t start_address_local;
  uint64_t size_local;
  void *data_local;
  FILE *stream_local;
  
  prev_iov.iov_len = (size_t)data;
  if (prev == (void *)0x0) {
    print_data(stream,(iovec *)&prev_iov.iov_len,1,start_address,(iovec *)0x0,0,flags);
  }
  else {
    local_58 = (undefined1  [8])prev;
    prev_iov.iov_base = (void *)size;
    print_data(stream,(iovec *)&prev_iov.iov_len,1,start_address,(iovec *)local_58,1,flags);
  }
  return;
}

Assistant:

void print_data(FILE* stream, const void* data, uint64_t size,
    uint64_t start_address, const void* prev, uint64_t flags) {
  iovec iov;
  iov.iov_base = const_cast<void*>(data);
  iov.iov_len = size;
  if (prev) {
    iovec prev_iov;
    prev_iov.iov_base = const_cast<void*>(prev);
    prev_iov.iov_len = size;
    print_data(stream, &iov, 1, start_address, &prev_iov, 1, flags);
  } else {
    print_data(stream, &iov, 1, start_address, nullptr, 0, flags);
  }
}